

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_array_suite.cpp
# Opt level: O3

void api_suite::api_clear(void)

{
  undefined8 local_78;
  undefined4 local_6c;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 *local_48;
  undefined8 **local_40;
  undefined8 *local_38;
  
  local_38 = &local_60;
  local_60 = 0;
  uStack_58 = 0;
  local_50 = 0;
  local_40 = &local_48;
  local_48 = &local_68;
  local_68 = 0x10000000b;
  local_78 = 1;
  local_6c = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("array.size()","1",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/map_array_suite.cpp"
             ,0x49,"void api_suite::api_clear()",&local_78,&local_6c);
  local_38 = local_48;
  local_78 = 0;
  local_6c = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("array.size()","0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/map_array_suite.cpp"
             ,0x4b,"void api_suite::api_clear()",&local_78,&local_6c);
  return;
}

Assistant:

void api_ctor_default()
{
    map_array<int, int, 4> array;
    BOOST_TEST_EQ(array.size(), 0);
    BOOST_TEST_EQ(array.capacity(), 4);
}